

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::setFocusHelper
          (QGraphicsItemPrivate *this,FocusReason focusReason,bool climb,bool focusFromHide)

{
  QGraphicsItem **ppQVar1;
  QGraphicsScene *this_00;
  bool bVar2;
  QGraphicsItem **ppQVar3;
  QGraphicsItem *pQVar4;
  QGraphicsItemPrivate *pQVar5;
  QGraphicsItem *pQVar6;
  QGraphicsItem *other;
  
  if ((((this->q_ptr->d_ptr).d)->field_0x160 & 0x80) == 0) {
    return;
  }
  if ((this->field_0x164 & 4) == 0) {
    return;
  }
  ppQVar1 = &this->q_ptr;
  ppQVar3 = ppQVar1;
  do {
    other = *ppQVar3;
    pQVar5 = (other->d_ptr).d;
    ppQVar3 = &pQVar5->focusProxy;
  } while (pQVar5->focusProxy != (QGraphicsItem *)0x0);
  pQVar5 = this;
  if (((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0) &&
     (pQVar4 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene), pQVar4 == other)) {
    return;
  }
  do {
    pQVar4 = pQVar5->parent;
    if (pQVar4 == (QGraphicsItem *)0x0) goto LAB_005e9389;
    pQVar5 = (pQVar4->d_ptr).d;
  } while ((pQVar5->field_0x165 & 0x80) == 0);
  pQVar6 = pQVar5->focusScopeItem;
  pQVar5->focusScopeItem = *ppQVar1;
  if (pQVar6 != (QGraphicsItem *)0x0) {
    pQVar5 = (pQVar6->d_ptr).d;
    (*pQVar5->_vptr_QGraphicsItemPrivate[9])(pQVar5,0);
  }
  (*this->_vptr_QGraphicsItemPrivate[9])(this,1);
  if (((pQVar4->d_ptr).d)->subFocusItem == (QGraphicsItem *)0x0 && !focusFromHide) {
    return;
  }
LAB_005e9389:
  pQVar4 = other;
  if (climb) {
    do {
      other = pQVar4;
      pQVar4 = ((other->d_ptr).d)->focusScopeItem;
      if (pQVar4 == (QGraphicsItem *)0x0) break;
    } while ((((pQVar4->d_ptr).d)->field_0x160 & 0x20) != 0);
  }
  if (((QGraphicsScene *)this->scene != (QGraphicsScene *)0x0) &&
     (pQVar4 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene),
     pQVar4 != (QGraphicsItem *)0x0)) {
    pQVar4 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
    pQVar4 = QGraphicsItem::panel(pQVar4);
    pQVar6 = QGraphicsItem::panel(this->q_ptr);
    if (pQVar4 == pQVar6) {
      pQVar4 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
      pQVar4 = QGraphicsItem::commonAncestorItem(pQVar4,other);
      pQVar6 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
      pQVar5 = (pQVar6->d_ptr).d;
      pQVar6 = QGraphicsScene::focusItem((QGraphicsScene *)this->scene);
      clearSubFocus(pQVar5,pQVar6,pQVar4);
      goto LAB_005e93f6;
    }
  }
  pQVar4 = (QGraphicsItem *)0x0;
LAB_005e93f6:
  setSubFocus((other->d_ptr).d,other,pQVar4);
  this_00 = (QGraphicsScene *)this->scene;
  if (this_00 != (QGraphicsScene *)0x0) {
    pQVar4 = QGraphicsItem::panel(*ppQVar1);
    if (pQVar4 == (QGraphicsItem *)0x0) {
      bVar2 = QGraphicsScene::isActive(this_00);
    }
    else {
      bVar2 = QGraphicsItem::isActive(pQVar4);
    }
    if (bVar2 != false) {
      QGraphicsScenePrivate::setFocusItemHelper
                (*(QGraphicsScenePrivate **)&this->scene->field_0x8,other,focusReason,true);
      return;
    }
  }
  return;
}

Assistant:

void QGraphicsItemPrivate::setFocusHelper(Qt::FocusReason focusReason, bool climb, bool focusFromHide)
{
    // Disabled / unfocusable items cannot accept focus.
    if (!q_ptr->isEnabled() || !(flags & QGraphicsItem::ItemIsFocusable))
        return;

    // Find focus proxy.
    QGraphicsItem *f = q_ptr;
    while (f->d_ptr->focusProxy)
        f = f->d_ptr->focusProxy;

    // Return if it already has focus.
    if (scene && scene->focusItem() == f)
        return;

    // Update focus scope item ptr.
    QGraphicsItem *p = parent;
    while (p) {
        if (p->flags() & QGraphicsItem::ItemIsFocusScope) {
            QGraphicsItem *oldFocusScopeItem = p->d_ptr->focusScopeItem;
            p->d_ptr->focusScopeItem = q_ptr;
            if (oldFocusScopeItem)
                oldFocusScopeItem->d_ptr->focusScopeItemChange(false);
            focusScopeItemChange(true);
            if (!p->focusItem() && !focusFromHide) {
                // Calling setFocus() on a child of a focus scope that does
                // not have focus changes only the focus scope pointer,
                // so that focus is restored the next time the scope gains
                // focus.
                return;
            }
            break;
        }
        p = p->d_ptr->parent;
    }

    if (climb) {
        while (f->d_ptr->focusScopeItem && f->d_ptr->focusScopeItem->isVisible())
            f = f->d_ptr->focusScopeItem;
    }

    // Update the child focus chain.
    QGraphicsItem *commonAncestor = nullptr;
    if (scene && scene->focusItem() && scene->focusItem()->panel() == q_ptr->panel()) {
        commonAncestor = scene->focusItem()->commonAncestorItem(f);
        scene->focusItem()->d_ptr->clearSubFocus(scene->focusItem(), commonAncestor);
    }

    f->d_ptr->setSubFocus(f, commonAncestor);

    // Update the scene's focus item.
    if (scene) {
        QGraphicsItem *p = q_ptr->panel();
        if ((!p && scene->isActive()) || (p && p->isActive())) {
            // Visible items immediately gain focus from scene.
            scene->d_func()->setFocusItemHelper(f, focusReason);
        }
    }
}